

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_pcnt_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  int64_t iVar3;
  wr_t *pws;
  wr_t *pwd;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  iVar3 = msa_pcnt_df(0,(long)*(char *)pfVar2);
  *(char *)pfVar1 = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 1));
  *(char *)((long)pfVar1 + 1) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 2));
  *(char *)((long)pfVar1 + 2) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 3));
  *(char *)((long)pfVar1 + 3) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 4));
  *(char *)((long)pfVar1 + 4) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 5));
  *(char *)((long)pfVar1 + 5) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 6));
  *(char *)((long)pfVar1 + 6) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 7));
  *(char *)((long)pfVar1 + 7) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 8));
  *(char *)((long)pfVar1 + 8) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 9));
  *(char *)((long)pfVar1 + 9) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 10));
  *(char *)((long)pfVar1 + 10) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 0xb));
  *(char *)((long)pfVar1 + 0xb) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 0xc));
  *(char *)((long)pfVar1 + 0xc) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 0xd));
  *(char *)((long)pfVar1 + 0xd) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 0xe));
  *(char *)((long)pfVar1 + 0xe) = (char)iVar3;
  iVar3 = msa_pcnt_df(0,(long)*(char *)((long)pfVar2 + 0xf));
  *(char *)((long)pfVar1 + 0xf) = (char)iVar3;
  return;
}

Assistant:

void helper_msa_pcnt_b(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->b[0]  = msa_pcnt_df(DF_BYTE, pws->b[0]);
    pwd->b[1]  = msa_pcnt_df(DF_BYTE, pws->b[1]);
    pwd->b[2]  = msa_pcnt_df(DF_BYTE, pws->b[2]);
    pwd->b[3]  = msa_pcnt_df(DF_BYTE, pws->b[3]);
    pwd->b[4]  = msa_pcnt_df(DF_BYTE, pws->b[4]);
    pwd->b[5]  = msa_pcnt_df(DF_BYTE, pws->b[5]);
    pwd->b[6]  = msa_pcnt_df(DF_BYTE, pws->b[6]);
    pwd->b[7]  = msa_pcnt_df(DF_BYTE, pws->b[7]);
    pwd->b[8]  = msa_pcnt_df(DF_BYTE, pws->b[8]);
    pwd->b[9]  = msa_pcnt_df(DF_BYTE, pws->b[9]);
    pwd->b[10] = msa_pcnt_df(DF_BYTE, pws->b[10]);
    pwd->b[11] = msa_pcnt_df(DF_BYTE, pws->b[11]);
    pwd->b[12] = msa_pcnt_df(DF_BYTE, pws->b[12]);
    pwd->b[13] = msa_pcnt_df(DF_BYTE, pws->b[13]);
    pwd->b[14] = msa_pcnt_df(DF_BYTE, pws->b[14]);
    pwd->b[15] = msa_pcnt_df(DF_BYTE, pws->b[15]);
}